

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_markers.cpp
# Opt level: O2

DASHEventMessageBoxv1 *
generate_event_message_vtt_time
          (DASHEventMessageBoxv1 *__return_storage_ptr__,uint32_t id,uint64_t presentation_time,
          uint64_t duration,uint32_t timescale,uint32_t off)

{
  tm *__tp;
  int k;
  long lVar1;
  uchar local_111;
  time_t epochTime;
  char timestamp [64];
  
  event_track::DASHEventMessageBoxv1::DASHEventMessageBoxv1(__return_storage_ptr__);
  memset((DASHEventMessageBoxv1 *)timestamp,0,0xd8);
  event_track::DASHEventMessageBoxv1::DASHEventMessageBoxv1((DASHEventMessageBoxv1 *)timestamp);
  event_track::DASHEventMessageBoxv1::operator=
            (__return_storage_ptr__,(DASHEventMessageBoxv1 *)timestamp);
  event_track::DASHEventMessageBoxv1::~DASHEventMessageBoxv1((DASHEventMessageBoxv1 *)timestamp);
  __return_storage_ptr__->id_ = id;
  __return_storage_ptr__->presentation_time_ = presentation_time;
  __return_storage_ptr__->event_duration_ = (uint32_t)duration;
  *(uint32_t *)&(__return_storage_ptr__->super_full_box).field_0x6c = timescale;
  std::__cxx11::string::assign((char *)&__return_storage_ptr__->scheme_id_uri_);
  timestamp[0x30] = '\0';
  timestamp[0x31] = '\0';
  timestamp[0x32] = '\0';
  timestamp[0x33] = '\0';
  timestamp[0x34] = '\0';
  timestamp[0x35] = '\0';
  timestamp[0x36] = '\0';
  timestamp[0x37] = '\0';
  timestamp[0x38] = '\0';
  timestamp[0x39] = '\0';
  timestamp[0x3a] = '\0';
  timestamp[0x3b] = '\0';
  timestamp[0x3c] = '\0';
  timestamp[0x3d] = '\0';
  timestamp[0x3e] = '\0';
  timestamp[0x3f] = '\0';
  timestamp[0x20] = '\0';
  timestamp[0x21] = '\0';
  timestamp[0x22] = '\0';
  timestamp[0x23] = '\0';
  timestamp[0x24] = '\0';
  timestamp[0x25] = '\0';
  timestamp[0x26] = '\0';
  timestamp[0x27] = '\0';
  timestamp[0x28] = '\0';
  timestamp[0x29] = '\0';
  timestamp[0x2a] = '\0';
  timestamp[0x2b] = '\0';
  timestamp[0x2c] = '\0';
  timestamp[0x2d] = '\0';
  timestamp[0x2e] = '\0';
  timestamp[0x2f] = '\0';
  timestamp[0x10] = '\0';
  timestamp[0x11] = '\0';
  timestamp[0x12] = '\0';
  timestamp[0x13] = '\0';
  timestamp[0x14] = '\0';
  timestamp[0x15] = '\0';
  timestamp[0x16] = '\0';
  timestamp[0x17] = '\0';
  timestamp[0x18] = '\0';
  timestamp[0x19] = '\0';
  timestamp[0x1a] = '\0';
  timestamp[0x1b] = '\0';
  timestamp[0x1c] = '\0';
  timestamp[0x1d] = '\0';
  timestamp[0x1e] = '\0';
  timestamp[0x1f] = '\0';
  timestamp[0] = '\0';
  timestamp[1] = '\0';
  timestamp[2] = '\0';
  timestamp[3] = '\0';
  timestamp[4] = '\0';
  timestamp[5] = '\0';
  timestamp[6] = '\0';
  timestamp[7] = '\0';
  timestamp[8] = '\0';
  timestamp[9] = '\0';
  timestamp[10] = '\0';
  timestamp[0xb] = '\0';
  timestamp[0xc] = '\0';
  timestamp[0xd] = '\0';
  timestamp[0xe] = '\0';
  timestamp[0xf] = '\0';
  epochTime = (long)presentation_time / (long)(ulong)timescale;
  __tp = gmtime(&epochTime);
  strftime(timestamp,0x40,"%Y-%m-%d %H:%M:%S",__tp);
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
    local_111 = timestamp[lVar1];
    if (local_111 != '\0') {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&__return_storage_ptr__->message_data_,&local_111);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

event_track::DASHEventMessageBoxv1 generate_event_message_vtt_time(
    uint32_t id,
    uint64_t presentation_time,
    uint64_t duration,
    uint32_t timescale,
    uint32_t off)
{

    event_track::DASHEventMessageBoxv1 ev;
    ev = {};
    ev.id_ = id;
    ev.presentation_time_ = presentation_time;
    ev.event_duration_ = (uint32_t)duration;
    ev.timescale_ = timescale;
    ev.scheme_id_uri_ = "urn:webvtt";

    //static std::string getTimeStamp(time_t epochTime, const char* format = "%Y-%m-%d %H:%M:%S")
    //{
    char timestamp[64] = { 0 };
    const char* format = "%Y-%m-%d %H:%M:%S";
    std::time_t epochTime = (time_t) presentation_time / timescale;
    std::strftime(timestamp, sizeof(timestamp), format, gmtime(&epochTime));
    
    for (int k = 0; k < 64; k++)
        if(timestamp[k] != '\0')
           ev.message_data_.push_back(timestamp[k]);

    return ev;
}